

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O1

void g_tree_insert_internal(GTree *tree,gpointer key,gpointer value,gboolean replace)

{
  gint gVar1;
  long lVar2;
  GTreeNode *pGVar3;
  GTreeNode *pGVar4;
  GTree *pGVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  bool bVar9;
  bool bVar10;
  GTreeNode *path [40];
  undefined8 local_180;
  undefined8 local_178 [41];
  
  pGVar4 = tree->root;
  local_180._4_4_ = replace;
  if (pGVar4 == (GTreeNode *)0x0) {
    pGVar4 = (GTreeNode *)g_slice_alloc(0x28);
    pGVar4->left = (GTreeNode *)0x0;
    pGVar4->right = (GTreeNode *)0x0;
    *(undefined4 *)((long)&pGVar4->right + 7) = 0;
    pGVar4->key = key;
    pGVar4->value = value;
    tree->root = pGVar4;
    tree->nnodes = tree->nnodes + 1;
  }
  else {
    local_178[0] = 0;
    iVar7 = 1;
    do {
      gVar1 = (*tree->key_compare)(key,pGVar4->key,tree->key_compare_data);
      if (gVar1 == 0) {
        if (tree->value_destroy_func != (GDestroyNotify)0x0) {
          (*tree->value_destroy_func)(pGVar4->value);
        }
        pGVar4->value = value;
        if (local_180._4_4_ == 0) {
          iVar6 = 1;
          if (tree->key_destroy_func != (GDestroyNotify)0x0) {
            (*tree->key_destroy_func)(key);
          }
        }
        else {
          if (tree->key_destroy_func != (GDestroyNotify)0x0) {
            (*tree->key_destroy_func)(pGVar4->key);
          }
          pGVar4->key = key;
          iVar6 = 1;
        }
      }
      else {
        if (gVar1 < 0) {
          lVar2 = 0x10;
          if (pGVar4->left_child != '\0') goto LAB_004d8764;
          pGVar3 = (GTreeNode *)g_slice_alloc(0x28);
          pGVar3->left = (GTreeNode *)0x0;
          pGVar3->right = (GTreeNode *)0x0;
          *(undefined4 *)((long)&pGVar3->right + 7) = 0;
          pGVar3->key = key;
          pGVar3->value = value;
          pGVar3->left = pGVar4->left;
          pGVar3->right = pGVar4;
          pGVar4->left = pGVar3;
          pGVar4->left_child = '\x01';
          pGVar4->balance = pGVar4->balance + -1;
        }
        else {
          lVar2 = 0x18;
          if (pGVar4->right_child != '\0') {
LAB_004d8764:
            local_178[iVar7] = pGVar4;
            pGVar4 = *(GTreeNode **)((long)&pGVar4->key + lVar2);
            iVar7 = iVar7 + 1;
            iVar6 = 0;
            goto LAB_004d87cc;
          }
          pGVar3 = (GTreeNode *)g_slice_alloc(0x28);
          pGVar3->left = (GTreeNode *)0x0;
          pGVar3->right = (GTreeNode *)0x0;
          *(undefined4 *)((long)&pGVar3->right + 7) = 0;
          pGVar3->key = key;
          pGVar3->value = value;
          pGVar3->right = pGVar4->right;
          pGVar3->left = pGVar4;
          pGVar4->right = pGVar3;
          pGVar4->right_child = '\x01';
          pGVar4->balance = pGVar4->balance + '\x01';
        }
        tree->nnodes = tree->nnodes + 1;
        iVar6 = 5;
      }
LAB_004d87cc:
    } while (iVar6 == 0);
    if (iVar6 == 5) {
      plVar8 = &local_180 + iVar7;
      do {
        pGVar3 = (GTreeNode *)*plVar8;
        if (pGVar3 == (GTreeNode *)0x0) {
          bVar9 = false;
        }
        else {
          bVar9 = pGVar4 == pGVar3->left;
        }
        if ((byte)(pGVar4->balance - 2U) < 0xfd) {
          pGVar4 = g_tree_node_balance(pGVar4);
          pGVar5 = tree;
          if (pGVar3 != (GTreeNode *)0x0) {
            if (bVar9) {
              pGVar5 = (GTree *)&pGVar3->left;
            }
            else {
              pGVar5 = (GTree *)&pGVar3->right;
            }
          }
          pGVar5->root = pGVar4;
        }
        bVar10 = pGVar4->balance != '\0';
        if (bVar10 && pGVar3 != (GTreeNode *)0x0) {
          pGVar3->balance = pGVar3->balance + (-bVar9 | 1U);
          pGVar4 = pGVar3;
        }
        plVar8 = plVar8 + -1;
      } while (bVar10 && pGVar3 != (GTreeNode *)0x0);
    }
  }
  return;
}

Assistant:

static void g_tree_insert_internal (GTree *tree, gpointer key, gpointer value, gboolean replace)
{
    GTreeNode *node;
    GTreeNode *path[MAX_GTREE_HEIGHT];
    int idx;

    g_return_if_fail (tree != NULL);

    if (!tree->root)
    {
        tree->root = g_tree_node_new (key, value);
        tree->nnodes++;
        return;
    }

    idx = 0;
    path[idx++] = NULL;
    node = tree->root;

    while (1)
    {
        int cmp = tree->key_compare (key, node->key, tree->key_compare_data);

        if (cmp == 0)
        {
            if (tree->value_destroy_func)
                tree->value_destroy_func (node->value);

            node->value = value;

            if (replace)
            {
                if (tree->key_destroy_func)
                    tree->key_destroy_func (node->key);

                node->key = key;
            }
            else
            {
                /* free the passed key */
                if (tree->key_destroy_func)
                    tree->key_destroy_func (key);
            }

            return;
        }
        else if (cmp < 0)
        {
            if (node->left_child)
            {
                path[idx++] = node;
                node = node->left;
            }
            else
            {
                GTreeNode *child = g_tree_node_new (key, value);

                child->left = node->left;
                child->right = node;
                node->left = child;
                node->left_child = TRUE;
                node->balance -= 1;

                tree->nnodes++;

                break;
            }
        }
        else
        {
            if (node->right_child)
            {
                path[idx++] = node;
                node = node->right;
            }
            else
            {
                GTreeNode *child = g_tree_node_new (key, value);

                child->right = node->right;
                child->left = node;
                node->right = child;
                node->right_child = TRUE;
                node->balance += 1;

                tree->nnodes++;

                break;
            }
        }
    }

    /* Restore balance. This is the goodness of a non-recursive
     * implementation, when we are done with balancing we 'break'
     * the loop and we are done.
     */
    while (1)
    {
        GTreeNode *bparent = path[--idx];
        gboolean left_node = (bparent && node == bparent->left);
        //g_assert (!bparent || bparent->left == node || bparent->right == node);

        if (node->balance < -1 || node->balance > 1)
        {
            node = g_tree_node_balance (node);
            if (bparent == NULL)
                tree->root = node;
            else if (left_node)
                bparent->left = node;
            else
                bparent->right = node;
        }

        if (node->balance == 0 || bparent == NULL)
            break;

        if (left_node)
            bparent->balance -= 1;
        else
            bparent->balance += 1;

        node = bparent;
    }
}